

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int64_t mtree_atol10(char **p)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  
  cVar1 = **p;
  uVar3 = 7;
  if (cVar1 == '-') {
    *p = *p + 1;
    uVar3 = 8;
  }
  uVar6 = (int)**p - 0x30;
  if (uVar6 < 10) {
    lVar5 = 0;
    do {
      if ((0xccccccccccccccc < lVar5) || (uVar3 < uVar6 && lVar5 == 0xccccccccccccccc)) {
        lVar5 = 0x7fffffffffffffff;
        lVar4 = -0x8000000000000000;
        goto LAB_0012cab6;
      }
      lVar5 = (ulong)uVar6 + lVar5 * 10;
      pcVar2 = *p;
      *p = pcVar2 + 1;
      uVar6 = (int)pcVar2[1] - 0x30;
    } while (uVar6 < 10);
  }
  else {
    lVar5 = 0;
  }
  lVar4 = -lVar5;
LAB_0012cab6:
  if (cVar1 != '-') {
    lVar4 = lVar5;
  }
  return lVar4;
}

Assistant:

static int64_t
mtree_atol10(char **p)
{
	int64_t l, limit, last_digit_limit;
	int base, digit, sign;

	base = 10;

	if (**p == '-') {
		sign = -1;
		limit = ((uint64_t)(INT64_MAX) + 1) / base;
		last_digit_limit = ((uint64_t)(INT64_MAX) + 1) % base;
		++(*p);
	} else {
		sign = 1;
		limit = INT64_MAX / base;
		last_digit_limit = INT64_MAX % base;
	}

	l = 0;
	digit = **p - '0';
	while (digit >= 0 && digit < base) {
		if (l > limit || (l == limit && digit > last_digit_limit))
			return (sign < 0) ? INT64_MIN : INT64_MAX;
		l = (l * base) + digit;
		digit = *++(*p) - '0';
	}
	return (sign < 0) ? -l : l;
}